

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_portable.h
# Opt level: O0

void __thiscall
highwayhash::Portable::HHStatePortable::UpdateRemainder
          (HHStatePortable *this,char *bytes,size_t size_mod32)

{
  uint64_t in_RDX;
  char *in_RSI;
  HHStatePortable *in_RDI;
  uint64_t last4_1;
  uint32_t last4;
  HHPacket packet;
  char *remainder;
  size_t size_mod4;
  int lane;
  uint64_t mod32_pair;
  Load3 local_b1;
  uint64_t local_b0;
  Load3 local_a5;
  uint32_t local_a4;
  char local_a0 [16];
  char acStack_90 [12];
  char acStack_84 [28];
  char *local_68;
  ulong local_60;
  int local_54;
  long local_50;
  ulong local_48;
  char *local_40;
  
  local_50 = (in_RDX << 0x20) + in_RDX;
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    in_RDI->v0[local_54] = local_50 + in_RDI->v0[local_54];
  }
  local_48 = in_RDX;
  local_40 = in_RSI;
  Rotate32By((uint32_t *)in_RDI->v1,in_RDX);
  local_60 = local_48 & 3;
  local_68 = local_40 + (local_48 & 0xfffffffffffffffc);
  memset(local_a0,0,0x20);
  CopyPartial(local_40,(long)local_68 - (long)local_40,local_a0);
  if ((local_48 & 0x10) == 0) {
    local_b0 = Load3::operator()(&local_b1,local_68,local_60);
    local_b0 = host_from_le64(local_b0);
    CopyPartial((char *)&local_b0,8,acStack_90);
  }
  else {
    local_a4 = Load3::operator()(&local_a5,local_68,local_60);
    local_a4 = host_from_le32(local_a4);
    CopyPartial((char *)&local_a4,4,acStack_84);
  }
  Update(in_RDI,(HHPacket *)local_a0);
  return;
}

Assistant:

HH_INLINE void UpdateRemainder(const char* bytes, const size_t size_mod32) {
    // 'Length padding' differentiates zero-valued inputs that have the same
    // size/32. mod32 is sufficient because each Update behaves as if a
    // counter were injected, because the state is large and mixed thoroughly.
    const uint64_t mod32_pair =
        (static_cast<uint64_t>(size_mod32) << 32) + size_mod32;
    for (int lane = 0; lane < kNumLanes; ++lane) {
      v0[lane] += mod32_pair;
    }
    Rotate32By(reinterpret_cast<uint32_t*>(&v1), size_mod32);

    const size_t size_mod4 = size_mod32 & 3;
    const char* remainder = bytes + (size_mod32 & ~3);

    HH_ALIGNAS(32) HHPacket packet = {0};
    CopyPartial(bytes, remainder - bytes, &packet[0]);

    if (size_mod32 & 16) {  // 16..31 bytes left
      // Read the last 0..3 bytes and previous 1..4 into the upper bits.
      // Insert into the upper four bytes of packet, which are zero.
      uint32_t last4 =
          Load3()(Load3::AllowReadBeforeAndReturn(), remainder, size_mod4);
      last4 = host_from_le32(last4);

      CopyPartial(reinterpret_cast<const char*>(&last4), 4, &packet[28]);
    } else {  // size_mod32 < 16
      uint64_t last4 = Load3()(Load3::AllowUnordered(), remainder, size_mod4);
      last4 = host_from_le64(last4);

      // Rather than insert at packet + 28, it is faster to initialize
      // the otherwise empty packet + 16 with up to 64 bits of padding.
      CopyPartial(reinterpret_cast<const char*>(&last4), sizeof(last4),
                  &packet[16]);
    }
    Update(packet);
  }